

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  byte *pbVar8;
  
  if (end <= ptr) {
    return -4;
  }
  iVar5 = 0;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_00554ba0_caseD_0;
  default:
    pbVar8 = (byte *)(ptr + 1);
    break;
  case 4:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -1;
    }
    if (*pbVar8 == 0x5d) {
      pcVar7 = ptr + 2;
      if (end == pcVar7 || (long)end - (long)pcVar7 < 0) {
        return -1;
      }
      if (*pcVar7 == '>') {
        ptr = ptr + 3;
        iVar5 = 0x28;
        goto switchD_00554ba0_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)(end + -(long)ptr) < 2) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)(end + -(long)ptr));
    iVar5 = 0;
    if (iVar4 != 0) goto switchD_00554ba0_caseD_0;
    pbVar8 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar4 = (*enc[3].sameName)(enc,ptr,end);
    if (iVar4 != 0) goto switchD_00554ba0_caseD_0;
    pbVar8 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,end + -(long)ptr);
    if (iVar4 != 0) goto switchD_00554ba0_caseD_0;
    pbVar8 = (byte *)(ptr + 4);
    break;
  case 9:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -1;
    }
    pbVar1 = (byte *)(ptr + 1);
    ptr = ptr + 2;
    if (*(char *)((long)enc[1].scanners + (ulong)*pbVar1) != '\n') {
      ptr = (char *)pbVar8;
    }
    goto LAB_00554cb1;
  case 10:
    ptr = ptr + 1;
LAB_00554cb1:
    iVar5 = 7;
    goto switchD_00554ba0_caseD_0;
  }
  for (ptr = (char *)pbVar8; uVar3 = (long)end - (long)ptr, 0 < (long)uVar3;
      ptr = (char *)((byte *)ptr + lVar6)) {
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    lVar6 = 1;
    if ((ulong)bVar2 < 0xb) {
      pcVar7 = (char *)((long)&switchD_00554cfc::switchdataD_00667fc0 +
                       (long)(int)(&switchD_00554cfc::switchdataD_00667fc0)[bVar2]);
      switch(bVar2) {
      default:
        goto switchD_00554cfc_caseD_0;
      case 2:
      case 3:
        goto switchD_00554cfc_caseD_2;
      case 5:
        if (uVar3 == 1) goto switchD_00554cfc_caseD_0;
        iVar5 = (*enc[3].literalScanners[1])(enc,ptr,pcVar7,(char **)0x1);
        lVar6 = 2;
        break;
      case 6:
        if (uVar3 < 3) goto switchD_00554cfc_caseD_0;
        iVar5 = (*enc[3].sameName)(enc,ptr,pcVar7);
        lVar6 = 3;
        break;
      case 7:
        if (uVar3 < 4) goto switchD_00554cfc_caseD_0;
        iVar5 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar7,(char *)0x1);
        lVar6 = 4;
      }
      if (iVar5 != 0) break;
    }
switchD_00554cfc_caseD_2:
  }
switchD_00554cfc_caseD_0:
  iVar5 = 6;
switchD_00554ba0_caseD_0:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr,
                        const char *end, const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}